

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::table_t<$fff27d53$>::table_t
          (table_t<_fff27d53_> *this,string *name_,columns_type *columns_)

{
  tuple<_b35031e6_> *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = (string)0x0;
  std::tuple<$b35031e6$>::tuple(in_RDX,(tuple<_b35031e6_> *)in_RDI);
  return;
}

Assistant:

table_t(decltype(name) name_, columns_type columns_) :
        table_base{std::move(name_)}, columns(std::move(columns_)) {}